

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUFA.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_176::GUFAOptimizer::visitFunction(GUFAOptimizer *this,Function *func)

{
  Module *pMVar1;
  FeaturePolicy in_ECX;
  Expression **ppEVar2;
  undefined1 local_310 [8];
  PassRunner runner;
  undefined1 auStack_1a8 [8];
  Adder adder;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string local_68;
  string local_48;
  
  if (this->optimized == true) {
    ReFinalize::ReFinalize((ReFinalize *)local_310);
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              ((Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *)
               &runner.options.ignoreImplicitTraps,func,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
               ).
               super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
               .currModule);
    ReFinalize::~ReFinalize((ReFinalize *)local_310);
  }
  if ((this->castAll == true) &&
     (pMVar1 = (this->
               super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
               ).
               super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
               .currModule, ((pMVar1->features).features & 0x400) != 0)) {
    auStack_1a8 = (undefined1  [8])0x0;
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.replacep = (Expression **)0x0;
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.fixed._M_elems[9].currp
         = (Expression **)0x0;
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    adder.parent._0_1_ = '\0';
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)func;
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.currFunction =
         (Function *)pMVar1;
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.currModule = (Module *)this;
    Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::pushTask
              ((Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_> *)auStack_1a8,
               PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::scan,&func->body);
    while( true ) {
      if (((long)adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                 super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
                 super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start -
           (long)adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                 super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.fixed.
                 _M_elems[9].currp >> 4) +
          (long)adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.replacep == 0)
      break;
      if ((pointer)adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                   super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.fixed.
                   _M_elems[9].currp ==
          adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
          super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
            super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.replacep ==
            (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<Adder, wasm::UnifiedExpressionVisitor<Adder>>::Task, 10>::back() [T = wasm::Walker<Adder, wasm::UnifiedExpressionVisitor<Adder>>::Task, N = 10]"
                       );
        }
        ppEVar2 = adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                  super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.fixed.
                  _M_elems[(long)adder.
                                 super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>
                                 .super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                                 replacep + -2].currp;
        auStack_1a8 = (undefined1  [8])
                      adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                      super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.fixed.
                      _M_elems[(long)adder.
                                     super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>
                                     .
                                     super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>
                                     .replacep + -1].func;
        adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
        super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.replacep =
             (Expression **)
             ((long)adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.replacep + -1)
        ;
      }
      else {
        ppEVar2 = (Expression **)
                  adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                  super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
                  super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1].func;
        auStack_1a8 = (undefined1  [8])
                      adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                      super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.
                      flexible.
                      super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].currp;
        adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
        super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
             super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      if (*(Expression **)auStack_1a8 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<Adder, wasm::UnifiedExpressionVisitor<Adder>>::walk(Expression *&) [SubType = Adder, VisitorType = wasm::UnifiedExpressionVisitor<Adder>]"
                     );
      }
      (*(code *)ppEVar2)((Adder *)auStack_1a8,(Expression **)auStack_1a8);
    }
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task,_std::allocator<wasm::Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
    super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.currFunction = (Function *)0x0
    ;
    if ((char)adder.parent == '\x01') {
      ppEVar2 = adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.fixed.
                _M_elems[9].currp;
      ReFinalize::ReFinalize((ReFinalize *)local_310);
      in_ECX = (FeaturePolicy)ppEVar2;
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::
      walkFunctionInModule
                ((Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *)
                 &runner.options.ignoreImplicitTraps,func,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
                 ).
                 super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                 .currModule);
      ReFinalize::~ReFinalize((ReFinalize *)local_310);
      Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::~Walker
                ((Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_> *)auStack_1a8);
      this->optimized = true;
    }
    else {
      ppEVar2 = adder.super_PostWalker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.
                super_Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>.stack.fixed.
                _M_elems[9].currp;
      Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::~Walker
                ((Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_> *)auStack_1a8);
      in_ECX = (FeaturePolicy)ppEVar2;
    }
  }
  if (this->optimized == true) {
    EHUtils::handleBlockNestedPops
              ((EHUtils *)func,
               (Function *)
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
               ).
               super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
               .currModule,(Module *)0x0,in_ECX);
    if (this->optimizing == true) {
      PassRunner::PassRunner
                ((PassRunner *)local_310,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
                 ).super_Pass.runner);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"dce",(allocator<char> *)auStack_1a8);
      local_b8._M_engaged = false;
      PassRunner::add((PassRunner *)local_310,&local_68,
                      (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_b8);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_b8);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"vacuum",(allocator<char> *)auStack_1a8);
      local_90._M_engaged = false;
      PassRunner::add((PassRunner *)local_310,&local_48,
                      (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_90);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_90);
      std::__cxx11::string::~string((string *)&local_48);
      PassRunner::runOnFunction((PassRunner *)local_310,func);
      PassRunner::~PassRunner((PassRunner *)local_310);
    }
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    if (optimized) {
      // Optimization may introduce more unreachables, which we need to
      // propagate.
      ReFinalize().walkFunctionInModule(func, getModule());
    }

    // Potentially add new casts after we do our first pass of optimizations +
    // refinalize (doing it after refinalizing lets us add as few new casts as
    // possible).
    if (castAll && addNewCasts(func)) {
      optimized = true;
    }

    if (!optimized) {
      return;
    }

    // We may add blocks around pops, which we must fix up.
    EHUtils::handleBlockNestedPops(func, *getModule());

    // If we are in "optimizing" mode, we'll also run some more passes on this
    // function that we just optimized. If not, leave now.
    if (!optimizing) {
      return;
    }

    PassRunner runner(getPassRunner());
    // New unreachables we added have created dead code we can remove. If we do
    // not do this, then running GUFA repeatedly can actually increase code size
    // (by adding multiple unneeded unreachables).
    runner.add("dce");
    // New drops we added allow us to remove more unused code and values. As
    // with unreachables, without a vacuum we may increase code size as in
    // nested expressions we may apply the same value multiple times:
    //
    //  (block $out
    //   (block $in
    //    (i32.const 10)))
    //
    // In each of the blocks we'll infer the value must be 10, so we'll end up
    // with this repeating code:
    //
    //  (block ;; a new block just to drop the old outer block
    //   (drop
    //    (block $out
    //     (drop
    //      (block $in
    //       (i32.const 10)
    //      )
    //     )
    //     (i32.const 10)
    //    )
    //   )
    //   (i32.const 10)
    //  )
    runner.add("vacuum");
    runner.runOnFunction(func);
  }